

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall
testing::Matcher<mp::LogicalConstant>::Matcher
          (Matcher<mp::LogicalConstant> *this,LogicalConstant value)

{
  MatcherBase<mp::LogicalConstant> local_30;
  BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48> local_18;
  
  (this->super_MatcherBase<mp::LogicalConstant>).impl_.value_ =
       (MatcherInterface<mp::LogicalConstant> *)0x0;
  (this->super_MatcherBase<mp::LogicalConstant>).impl_.link_.next_ =
       &(this->super_MatcherBase<mp::LogicalConstant>).impl_.link_;
  (this->super_MatcherBase<mp::LogicalConstant>)._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001c9f38;
  local_18.super_ExprBase.impl_ =
       (ExprBase)
       (ExprBase)value.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_;
  internal::EqMatcher::operator_cast_to_Matcher
            ((Matcher<mp::LogicalConstant> *)&local_30,(EqMatcher *)&local_18);
  internal::linked_ptr<const_testing::MatcherInterface<mp::LogicalConstant>_>::operator=
            (&(this->super_MatcherBase<mp::LogicalConstant>).impl_,&local_30.impl_);
  internal::MatcherBase<mp::LogicalConstant>::~MatcherBase(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }